

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_13.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> lengths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  StringData sd;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined1 local_1d0 [32];
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"When","");
  local_1b0._M_p = (pointer)&local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"you","");
  local_190._M_p = (pointer)&local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"have","");
  local_170._M_p = (pointer)&local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"exhausted","");
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"all","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"posibilities","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,",","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"remember","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"this","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"-","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"you","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"haven\'t","");
  plVar2 = local_40;
  local_50[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".","");
  __l._M_len = 0xd;
  __l._M_array = (iterator)local_1d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e8,__l,(allocator_type *)&local_200);
  lVar3 = -0x1a0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  str_lengths(&local_200,&local_1e8);
  analyze_strings((StringData *)local_1d0,&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Longest: \'",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'\nShortest: \'",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b0._M_p,local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'\nLexicographically first: \'",0x1c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_190._M_p,local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'\nLexicographically last: \'",0x1b);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_170._M_p,local_168);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != &local_180) {
    operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if (local_200.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_200.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return 0;
}

Assistant:

int main()
{
	try
	{
		std::vector<std::string> strings{
			"When", "you", "have", "exhausted", "all", "posibilities", ",", "remember",
			"this", "-", "you", "haven't", "."
		};

		auto lengths = str_lengths(strings);
		auto sd = analyze_strings(strings);

		std::cout << "Longest: '" << sd.longest
			<< "'\nShortest: '" << sd.shortest
			<< "'\nLexicographically first: '" << sd.first
			<< "'\nLexicographically last: '" << sd.last
			<< "'\n";
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
	return 0;
}